

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O2

acmod_id_t * mk_word_phone_list(char **btw_mark,uint32 *n_phone,char *word,lexicon_t *lex)

{
  uint uVar1;
  acmod_id_t *paVar2;
  lex_entry_t *plVar3;
  acmod_id_t *paVar4;
  char *pcVar5;
  ulong uVar6;
  ulong n_elem;
  
  plVar3 = lexicon_lookup(lex,word);
  if (plVar3 == (lex_entry_t *)0x0) {
    paVar4 = (acmod_id_t *)0x0;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0xec,"Unable to lookup word \'%s\' in the dictionary\n",word);
  }
  else {
    uVar1 = plVar3->phone_cnt;
    n_elem = (ulong)uVar1;
    paVar4 = (acmod_id_t *)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                            ,0xf5);
    pcVar5 = (char *)__ckd_calloc__(n_elem,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                    ,0xfa);
    if (n_elem != 0) {
      paVar2 = plVar3->ci_acmod_id;
      for (uVar6 = 0; n_elem != uVar6; uVar6 = uVar6 + 1) {
        paVar4[uVar6] = paVar2[uVar6];
      }
      pcVar5[uVar1 - 1] = '\x01';
    }
    *btw_mark = pcVar5;
    *n_phone = uVar1;
  }
  return paVar4;
}

Assistant:

acmod_id_t *
mk_word_phone_list(char **btw_mark,
		   uint32 *n_phone,
		   char *word,
		   lexicon_t *lex)
{
  uint32 n_p;
  lex_entry_t *e;
  char *btw;
  unsigned int i;
  acmod_id_t *p;
  
  /*
   * Determine the # of phones in the word.
   */
  
  e = lexicon_lookup(lex, word);
  if (e == NULL) {
    E_WARN("Unable to lookup word '%s' in the dictionary\n", word);
    
    return NULL;
  }
  n_p = e->phone_cnt;
  
  /*
   * Allocate the phone sequence
   */
  p = ckd_calloc(n_p, sizeof(acmod_id_t));
  
  /*
   * Allocate the between word markers
   */
  btw = ckd_calloc(n_p, sizeof(char));
  
  if (n_p != 0)
    {
      for (i = 0; i < n_p; i++) {
	p[i] = e->ci_acmod_id[i];
      }
      
      btw[n_p-1] = TRUE;/* mark word boundary following
			   kth phone */
    }
  
  *btw_mark = btw;
  *n_phone = n_p;
  
  return p;
}